

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.hpp
# Opt level: O0

size_t __thiscall pg::bitset::find_next(bitset *this,size_t pos)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  uint64_t m;
  size_t i;
  size_t pos_local;
  bitset *this_local;
  
  if ((pos == 0xffffffffffffffff) || (this->_size <= pos + 1)) {
    this_local = (bitset *)0xffffffffffffffff;
  }
  else {
    m = block_index(this,pos + 1);
    uVar3 = this->_bits[m];
    sVar2 = bit_index(this,pos + 1);
    uVar3 = uVar3 & -1L << ((byte)sVar2 & 0x3f);
    if (uVar3 == 0) {
      do {
        m = m + 1;
        sVar2 = num_blocks(this);
        bVar5 = false;
        if (m < sVar2) {
          bVar5 = this->_bits[m] == 0;
        }
      } while (bVar5);
      sVar2 = num_blocks(this);
      if (m == sVar2) {
        this_local = (bitset *)0xffffffffffffffff;
      }
      else {
        iVar4 = 0;
        for (uVar3 = this->_bits[m]; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
          iVar4 = iVar4 + 1;
        }
        iVar4 = iVar4 + 1;
        if (this->_bits[m] == 0) {
          iVar4 = 0;
        }
        this_local = (bitset *)(m * 0x40 + (long)iVar4 + -1);
      }
    }
    else {
      iVar4 = 0;
      for (uVar1 = uVar3; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar4 = iVar4 + 1;
      }
      iVar4 = iVar4 + 1;
      if (uVar3 == 0) {
        iVar4 = 0;
      }
      this_local = (bitset *)(m * 0x40 + (long)iVar4 + -1);
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t find_next(size_t pos) const
    {
        if (pos == npos or (pos+1) >= _size) return npos;
        pos++;
        size_t i = block_index(pos);
        uint64_t m = _bits[i] & (~uint64_t(0) << bit_index(pos));
        if (m) {
            return i*64 + __builtin_ffsll(m) - 1;
        } else {
            i += 1;
            while (i < num_blocks() and _bits[i] == 0) i++;
            if (i == num_blocks()) return npos;
            else return i*64 + __builtin_ffsll(_bits[i]) - 1;
        }
    }